

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_keydata.cpp
# Opt level: O0

void __thiscall
KeyData_FromStringExtPrivkeyDerive_Test::~KeyData_FromStringExtPrivkeyDerive_Test
          (KeyData_FromStringExtPrivkeyDerive_Test *this)

{
  KeyData_FromStringExtPrivkeyDerive_Test *this_local;
  
  ~KeyData_FromStringExtPrivkeyDerive_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(KeyData, FromStringExtPrivkeyDerive) {
  std::string key1 = "[3456789a/1h/2/3h]xprv9zt1onyw8BdEf7SQ6wUVH3bQQdGD9iy9QzXveQQRhX7i5iUN7jZgLbqFEe491LfjozztYa6bJAGZ65GmDCNcbjMdjZcgmdisPJwVjcfcDhV/0h/1";
  std::vector<uint32_t> array1{0x80000001, 2, 0x80000003, 0x80000000, 1};

  auto check_func = [](const KeyData& obj, const std::vector<uint32_t>& arr_obj) {
    auto obj_arr = obj.GetChildNumArray();
    EXPECT_TRUE(obj.IsValid());
    EXPECT_TRUE(obj.HasPrivkey());
    EXPECT_TRUE(obj.HasExtPubkey());
    EXPECT_TRUE(obj.HasExtPrivkey());
    EXPECT_EQ(arr_obj.size(), obj_arr.size());
    EXPECT_STREQ("1'/2/3'/0'/1", obj.GetBip32Path().c_str());
    EXPECT_STREQ("3456789a", obj.GetFingerprint().GetHex().c_str());
    EXPECT_STREQ(
        "xprvA4VvhNxX2aGK493zrwSDXjMPmt3tSyU3V76RkSSkexsoshMJvD4FfYdZJLTRrYaK2rg16qPEmg4KcwDnJ6VNwynQArQorw9R9fe1XZqTgKf",
        obj.GetExtPrivkey().ToString().c_str());
    EXPECT_STREQ(
        "02a6f2b5dc540788a972bf7e2e5f6275e3b78375cc8739ebc0bc509f06bb0a38c4",
        obj.GetPubkey().GetHex().c_str());
    for (size_t idx=0; idx<arr_obj.size(); ++idx) {
      EXPECT_EQ(arr_obj[idx], obj_arr[idx]);
    }
    EXPECT_STREQ(
        "[3456789a/1'/2/3'/0'/1]02a6f2b5dc540788a972bf7e2e5f6275e3b78375cc8739ebc0bc509f06bb0a38c4",
        obj.ToString().c_str());
    EXPECT_STREQ("0x80000001/0x2/0x80000003/0x80000000/0x1",
        obj.GetBip32Path(HardenedType::kNumber, true).c_str());

    EXPECT_STREQ(
        "[3456789a/1h/2/3h/0h/1]xprvA4VvhNxX2aGK493zrwSDXjMPmt3tSyU3V76RkSSkexsoshMJvD4FfYdZJLTRrYaK2rg16qPEmg4KcwDnJ6VNwynQArQorw9R9fe1XZqTgKf",
        obj.ToString(false, HardenedType::kSmallH).c_str());
  };

  KeyData obj1;
  try {
    obj1 = KeyData(key1);
    check_func(obj1, array1);
  } catch (const CfdException& e) {
    EXPECT_STREQ("", e.what());
  }
}